

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMesh * __thiscall ON_SubDMesh::CopyFrom(ON_SubDMesh *this,ON_SubDMesh *src)

{
  element_type *src_00;
  ON_SubDMeshImpl *this_00;
  undefined1 local_48 [8];
  shared_ptr<ON_SubDMeshImpl> new_impl_sp;
  ON_SubDMeshImpl *impl;
  ON_SubDMeshImpl *src_impl;
  ON_SubDMesh *src_local;
  ON_SubDMesh *this_local;
  
  if (this != src) {
    std::__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)this);
    src_00 = std::__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)src);
    if (src_00 != (element_type *)0x0) {
      this_00 = (ON_SubDMeshImpl *)operator_new(0xc0);
      ON_SubDMeshImpl::ON_SubDMeshImpl(this_00,src_00);
      std::shared_ptr<ON_SubDMeshImpl>::shared_ptr<ON_SubDMeshImpl,void>
                ((shared_ptr<ON_SubDMeshImpl> *)local_48,this_00);
      std::__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>::swap
                ((__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      std::shared_ptr<ON_SubDMeshImpl>::~shared_ptr((shared_ptr<ON_SubDMeshImpl> *)local_48);
    }
  }
  return this;
}

Assistant:

ON_SubDMesh& ON_SubDMesh::CopyFrom(
  const ON_SubDMesh& src
  )
{
  if (this != &src)
  {
    m_impl_sp.reset();
    const ON_SubDMeshImpl* src_impl = src.m_impl_sp.get();
    if (nullptr != src_impl)
    {
      ON_SubDMeshImpl* impl = new ON_SubDMeshImpl(*src_impl);
      std::shared_ptr< ON_SubDMeshImpl > new_impl_sp(impl);
      m_impl_sp.swap(new_impl_sp);
    }
  }
  return *this;
}